

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cpp
# Opt level: O0

void common_params_print_usage(common_params_context *ctx_arg)

{
  bool bVar1;
  reference this;
  long in_RDI;
  common_arg *opt;
  iterator __end1;
  iterator __begin1;
  vector<common_arg,_std::allocator<common_arg>_> *__range1;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  anon_class_1_0_00000001 print_options;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  reference in_stack_ffffffffffffff60;
  reference in_stack_ffffffffffffff68;
  common_arg *in_stack_ffffffffffffff70;
  __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_> local_68;
  long local_60;
  vector<common_arg_*,_std::allocator<common_arg_*>_> *in_stack_ffffffffffffffa8;
  anon_class_1_0_00000001 *in_stack_ffffffffffffffb0;
  
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x19b7fc);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x19b806);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)0x19b810);
  local_60 = in_RDI + 0x10;
  local_68._M_current =
       (common_arg *)
       std::vector<common_arg,_std::allocator<common_arg>_>::begin
                 ((vector<common_arg,_std::allocator<common_arg>_> *)
                  CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::vector<common_arg,_std::allocator<common_arg>_>::end
            ((vector<common_arg,_std::allocator<common_arg>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)in_stack_ffffffffffffff60,
                            (__normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)), bVar1
        ) {
    this = __gnu_cxx::
           __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
           operator*(&local_68);
    if ((this->is_sparam & 1U) == 0) {
      in_stack_ffffffffffffff5f =
           common_arg::in_example
                     (in_stack_ffffffffffffff70,
                      (llama_example)((ulong)in_stack_ffffffffffffff68 >> 0x20));
      if ((bool)in_stack_ffffffffffffff5f) {
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffff60,
                   (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
      else {
        std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                  ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)this,
                   (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        in_stack_ffffffffffffff60 = this;
        this = in_stack_ffffffffffffff68;
      }
    }
    else {
      std::vector<common_arg_*,_std::allocator<common_arg_*>_>::push_back
                ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffff60,
                 (value_type *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      this = in_stack_ffffffffffffff68;
    }
    __gnu_cxx::
    __normal_iterator<common_arg_*,_std::vector<common_arg,_std::allocator<common_arg>_>_>::
    operator++(&local_68);
    in_stack_ffffffffffffff68 = this;
  }
  printf("----- common params -----\n\n");
  common_params_print_usage::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  printf("\n\n----- sampling params -----\n\n");
  common_params_print_usage::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  printf("\n\n----- example-specific params -----\n\n");
  common_params_print_usage::anon_class_1_0_00000001::operator()
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffff70);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffff70);
  std::vector<common_arg_*,_std::allocator<common_arg_*>_>::~vector
            ((vector<common_arg_*,_std::allocator<common_arg_*>_> *)in_stack_ffffffffffffff70);
  return;
}

Assistant:

static void common_params_print_usage(common_params_context & ctx_arg) {
    auto print_options = [](std::vector<common_arg *> & options) {
        for (common_arg * opt : options) {
            printf("%s", opt->to_string().c_str());
        }
    };

    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;
    for (auto & opt : ctx_arg.options) {
        // in case multiple LLAMA_EXAMPLE_* are set, we prioritize the LLAMA_EXAMPLE_* matching current example
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }
    printf("----- common params -----\n\n");
    print_options(common_options);
    printf("\n\n----- sampling params -----\n\n");
    print_options(sparam_options);
    // TODO: maybe convert enum llama_example to string
    printf("\n\n----- example-specific params -----\n\n");
    print_options(specific_options);
}